

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O1

void test_null(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *extraout_RAX;
  char *extraout_RAX_00;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  void *pvVar12;
  int extraout_var;
  long extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RAX_03;
  bson_t *bson;
  char *__buf;
  char *__n;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  size_t sVar16;
  DIR *__dirp;
  dirent *pdVar17;
  FILE *__stream;
  long lVar18;
  uint extraout_EDX;
  char *__dest;
  ulong uVar19;
  char *pcVar20;
  DIR *__s;
  DIR *__name;
  char *pcVar21;
  DIR *pDVar22;
  DIR *__filename;
  undefined8 uVar23;
  DIR *pDVar24;
  undefined1 *puVar25;
  char *pcVar26;
  char *pcVar27;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 auStack_7598 [8];
  undefined1 auStack_7590 [504];
  ulong uStack_7398;
  DIR *pDStack_7390;
  char *pcStack_7388;
  DIR *pDStack_7380;
  DIR *pDStack_7378;
  int iStack_736c;
  DIR *pDStack_7368;
  stat sStack_7360;
  char acStack_72d0 [512];
  size_t sStack_70d0;
  char *pcStack_70c8;
  DIR *pDStack_70c0;
  char *pcStack_70b8;
  code *pcStack_70b0;
  char *pcStack_70a8;
  ulong uStack_70a0;
  char *pcStack_7098;
  DIR *pDStack_7090;
  undefined8 *puStack_7088;
  undefined8 uStack_7050;
  undefined1 *puStack_7048;
  undefined1 *puStack_7040;
  undefined1 auStack_7030 [8];
  char *pcStack_7028;
  undefined8 uStack_7018;
  char *pcStack_7010;
  undefined8 uStack_7008;
  undefined8 uStack_6ff0;
  DIR aDStack_6f80 [25944];
  char *pcStack_a28;
  char *pcStack_a20;
  char *pcStack_a18;
  char *pcStack_a10;
  code *apcStack_a08 [2];
  undefined1 auStack_9f8 [116];
  uint uStack_984;
  char acStack_980 [256];
  undefined8 uStack_880;
  char *pcStack_878;
  char *pcStack_870;
  char *pcStack_868;
  char *pcStack_860;
  char *pcStack_858;
  char *pcStack_850;
  undefined8 uStack_848;
  code *pcStack_840;
  char *pcStack_838;
  undefined8 uStack_830;
  char *pcStack_828;
  char *pcStack_820;
  char *pcStack_818;
  char *pcStack_810;
  code *pcStack_808;
  undefined8 uStack_800;
  undefined8 uStack_7f8;
  char *pcStack_7f0;
  char *pcStack_7e8;
  char *pcStack_7e0;
  undefined8 uStack_7d8;
  bson_t *pbStack_7d0;
  char *pcStack_7c8;
  code *pcStack_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  char *pcStack_7a0;
  char *pcStack_798;
  char *pcStack_790;
  char *pcStack_788;
  char *pcStack_780;
  code *pcStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_760;
  undefined1 *puStack_758;
  char *pcStack_750;
  char *pcStack_748;
  code *pcStack_740;
  undefined8 uStack_738;
  ulong uStack_730;
  ulong uStack_728;
  undefined1 *puStack_720;
  char *pcStack_718;
  void *pvStack_710;
  code *pcStack_708;
  uint uStack_684;
  undefined1 auStack_680 [4];
  uint uStack_67c;
  ulong uStack_530;
  ulong uStack_528;
  undefined1 *puStack_520;
  char *pcStack_518;
  void *pvStack_510;
  code *apcStack_508 [16];
  uint uStack_484;
  undefined1 auStack_480 [4];
  uint uStack_47c;
  undefined8 uStack_338;
  ulong uStack_330;
  undefined1 *puStack_328;
  char *pcStack_320;
  undefined8 uStack_318;
  code *apcStack_310 [2];
  undefined8 uStack_300;
  code *pcStack_2f8;
  undefined8 uStack_2e8;
  code *pcStack_2e0;
  long lStack_2d8;
  undefined8 uStack_2d0;
  code *pcStack_2c8;
  undefined8 uStack_2c0;
  int iStack_2b8;
  int iStack_2b4;
  undefined8 uStack_2b0;
  char *pcStack_2a8;
  code *pcStack_2a0;
  int iStack_294;
  ulong uStack_290;
  code *pcStack_288;
  undefined8 uStack_280;
  uint uStack_20c;
  char *pcStack_208;
  undefined1 auStack_200 [4];
  uint uStack_1fc;
  undefined8 uStack_f8;
  char *pcStack_c8;
  undefined8 uStack_c0;
  code *pcStack_b8;
  char *pcStack_b0;
  undefined8 uStack_a8;
  code *pcStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_88;
  char *pcStack_80;
  undefined1 auStack_74 [12];
  undefined8 uStack_68;
  char *pcStack_60;
  code *pcStack_58;
  undefined8 uStack_50;
  char *pcStack_40;
  char *pcStack_38;
  undefined8 uStack_30;
  char *pcStack_28;
  
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,9,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,9,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  test_null_cold_1();
  pcStack_28 = "foo";
  pcStack_58 = (code *)0x13b8a2;
  uStack_30 = uVar6;
  uVar6 = bson_bcon_magic();
  uStack_50 = 0;
  pcStack_58 = (code *)0x13b8d2;
  uVar6 = bcon_new(0,"foo",uVar6,10,"^foo|bar$","i");
  pcStack_58 = (code *)0x13b8da;
  uVar7 = bson_bcone_magic();
  uStack_50 = 0;
  pcStack_58 = (code *)0x13b8fd;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,10,&pcStack_38,&pcStack_40);
  if (cVar1 == '\0') {
    pcStack_58 = (code *)0x13b942;
    test_regex_cold_1();
LAB_0013b942:
    pcStack_58 = (code *)0x13b947;
    test_regex_cold_2();
  }
  else {
    pcStack_58 = (code *)0x13b912;
    iVar2 = strcmp(pcStack_38,"^foo|bar$");
    if (iVar2 != 0) goto LAB_0013b942;
    pcStack_58 = (code *)0x13b927;
    iVar2 = strcmp(pcStack_40,"i");
    if (iVar2 == 0) {
      pcStack_58 = (code *)0x13b933;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_58 = test_dbpointer;
  test_regex_cold_3();
  pcStack_58 = (code *)0x0;
  pcStack_60 = "foo";
  pcStack_a0 = (code *)0x13b967;
  uStack_68 = uVar6;
  bson_oid_init(auStack_74,0);
  pcStack_a0 = (code *)0x13b96c;
  uVar6 = bson_bcon_magic();
  uStack_98 = 0;
  pcStack_a0 = (code *)0x13b995;
  uVar6 = bcon_new(0,"foo",uVar6,0xb,"collection",auStack_74);
  pcStack_a0 = (code *)0x13b99d;
  uVar7 = bson_bcone_magic();
  uStack_98 = 0;
  pcStack_a0 = (code *)0x13b9c0;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xb,&pcStack_80,&uStack_88);
  if (cVar1 == '\0') {
    pcStack_a0 = (code *)0x13ba03;
    test_dbpointer_cold_1();
LAB_0013ba03:
    pcStack_a0 = (code *)0x13ba08;
    test_dbpointer_cold_2();
  }
  else {
    pcStack_a0 = (code *)0x13b9d5;
    iVar2 = strcmp(pcStack_80,"collection");
    if (iVar2 != 0) goto LAB_0013ba03;
    pcStack_a0 = (code *)0x13b9e8;
    cVar1 = bson_oid_equal(uStack_88,auStack_74);
    if (cVar1 != '\0') {
      pcStack_a0 = (code *)0x13b9f4;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_a0 = test_code;
  test_dbpointer_cold_3();
  pcStack_a0 = (code *)0x13e3df;
  pcStack_b8 = (code *)0x13ba16;
  pcStack_b0 = extraout_RAX;
  uStack_a8 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_b8 = (code *)0x13ba3b;
  uVar6 = bcon_new(0,"foo",uVar6,0xc,"var a = {};",0);
  pcStack_b8 = (code *)0x13ba43;
  uVar7 = bson_bcone_magic();
  pcStack_b8 = (code *)0x13ba5e;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xc,&pcStack_b0,0);
  if (cVar1 == '\0') {
    pcStack_b8 = (code *)0x13ba8b;
    test_code_cold_1();
  }
  else {
    pcStack_b8 = (code *)0x13ba72;
    iVar2 = strcmp(pcStack_b0,"var a = {};");
    if (iVar2 == 0) {
      pcStack_b8 = (code *)0x13ba7e;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_b8 = test_symbol;
  test_code_cold_2();
  pcStack_b8 = (code *)0x13e3df;
  pcStack_c8 = extraout_RAX_00;
  uStack_c0 = uVar6;
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0xd,"symbol",0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xd,&pcStack_c8,0);
  if (cVar1 == '\0') {
    test_symbol_cold_1();
  }
  else {
    iVar2 = strcmp(pcStack_c8,"symbol");
    if (iVar2 == 0) {
      bson_destroy(uVar6);
      return;
    }
  }
  test_symbol_cold_2();
  pcStack_288 = (code *)0x13bb30;
  uStack_f8 = uVar6;
  pvVar8 = (void *)bson_bcon_magic();
  puVar25 = (undefined1 *)0x0;
  pcStack_288 = (code *)0x13bb57;
  uVar9 = bcon_new(0,"b",pvVar8,0xf,10,0);
  uStack_280 = 0;
  pcVar27 = "foo";
  pcStack_288 = (code *)0x13bb83;
  uVar10 = bcon_new(0,"foo",pvVar8,0xe,"var a = b;",uVar9);
  pcStack_288 = (code *)0x13bb8b;
  uVar6 = bson_bcone_magic();
  uStack_280 = 0;
  pcStack_288 = (code *)0x13bbb1;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,0xe,&pcStack_208,auStack_200);
  if (cVar1 == '\0') {
LAB_0013bd4d:
    pcStack_288 = (code *)0x13bd52;
    test_codewscope_cold_1();
LAB_0013bd52:
    pcStack_288 = (code *)0x13bd57;
    test_codewscope_cold_2();
LAB_0013bd57:
    pcStack_288 = (code *)0x13bd5c;
    test_codewscope_cold_7();
LAB_0013bd5c:
    pcStack_288 = (code *)0x13bd61;
    test_codewscope_cold_6();
LAB_0013bd61:
    pcStack_288 = (code *)0x13bd66;
    test_codewscope_cold_3();
  }
  else {
    pcStack_288 = (code *)0x13bbca;
    iVar2 = strcmp(pcStack_208,"var a = b;");
    if (iVar2 != 0) goto LAB_0013bd52;
    pcStack_288 = (code *)0x13bbe2;
    pcVar27 = (char *)bson_get_data(auStack_200);
    pcStack_288 = (code *)0x13bbed;
    pvVar8 = (void *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_1fc) {
      pcStack_288 = (code *)0x13bc01;
      pvVar11 = (void *)bson_get_data(uVar9);
      pcStack_288 = (code *)0x13bc11;
      pvVar12 = (void *)bson_get_data(auStack_200);
      pcStack_288 = (code *)0x13bc1f;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        pcStack_288 = (code *)0x13bc30;
        bson_destroy(auStack_200);
        pcStack_288 = (code *)0x13bc38;
        bson_destroy(uVar9);
        pcStack_288 = (code *)0x13bc40;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar25 = auStack_200;
    pcStack_288 = (code *)0x13bc61;
    uVar6 = bson_as_canonical_extended_json(puVar25);
    pcStack_288 = (code *)0x13bc6e;
    uVar7 = bson_as_canonical_extended_json(uVar9);
    uVar10 = 0xffffffff;
    if (uStack_1fc != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar9 + 4) == (int)uVar19) break;
        if (pcVar27[uVar19] != *(char *)((long)pvVar8 + uVar19)) {
          uVar10 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (uStack_1fc != (uint)uVar19);
    }
    if ((int)uVar10 == -1) {
      uVar3 = uStack_1fc;
      if (uStack_1fc < *(uint *)(uVar9 + 4)) {
        uVar3 = *(uint *)(uVar9 + 4);
      }
      uVar10 = (ulong)(uVar3 - 1);
    }
    pcStack_288 = (code *)0x13bcc9;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar10,uVar6,uVar7);
    pcStack_288 = (code *)0x13bce1;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar10 = (ulong)uVar3;
    pcStack_288 = (code *)0x13bcfc;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_20c = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013bd57;
    puVar25 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013bd5c;
    uVar10 = (ulong)uStack_1fc;
    pcStack_288 = (code *)0x13bd26;
    uVar19 = write(uVar3,pcVar27,uVar10);
    if (uVar19 != uVar10) goto LAB_0013bd61;
    uVar9 = (ulong)*(uint *)(uVar9 + 4);
    pcStack_288 = (code *)0x13bd3c;
    uVar19 = write(uVar4,pvVar8,uVar9);
    if (uVar19 == uVar9) {
      pcStack_288 = (code *)0x13bd4d;
      test_codewscope_cold_5();
      goto LAB_0013bd4d;
    }
  }
  pcStack_288 = test_int32;
  test_codewscope_cold_4();
  pcStack_2a0 = (code *)0x13bd74;
  uStack_290 = uVar9;
  pcStack_288 = (code *)pvVar8;
  iStack_294 = extraout_var;
  uVar6 = bson_bcon_magic();
  pcStack_2a0 = (code *)0x13bd98;
  uVar6 = bcon_new(0,"foo",uVar6,0xf,10,0);
  pcStack_2a0 = (code *)0x13bda0;
  uVar7 = bson_bcone_magic();
  pcStack_2a0 = (code *)0x13bdbd;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xf,&iStack_294,0);
  if (cVar1 == '\0') {
    pcStack_2a0 = (code *)0x13bddd;
    test_int32_cold_1();
  }
  else if (iStack_294 == 10) {
    pcStack_2a0 = (code *)0x13bdd0;
    bson_destroy(uVar6);
    return;
  }
  pcStack_2a0 = test_timestamp;
  test_int32_cold_2();
  pcStack_2a8 = "foo";
  pcStack_2c8 = (code *)0x13bdf0;
  uStack_2b0 = uVar6;
  pcStack_2a0 = (code *)pcVar27;
  uVar6 = bson_bcon_magic();
  pvVar8 = (void *)0x0;
  uStack_2c0 = 0;
  pcStack_2c8 = (code *)0x13be1e;
  uVar6 = bcon_new(0,"foo",uVar6,0x10,100,1000);
  pcStack_2c8 = (code *)0x13be26;
  uVar7 = bson_bcone_magic();
  uStack_2c0 = 0;
  pcStack_2c8 = (code *)0x13be49;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x10,&iStack_2b4,&iStack_2b8);
  if (cVar1 == '\0') {
    pcStack_2c8 = (code *)0x13be75;
    test_timestamp_cold_1();
LAB_0013be75:
    pcStack_2c8 = (code *)0x13be7a;
    test_timestamp_cold_2();
  }
  else {
    if (iStack_2b4 != 100) goto LAB_0013be75;
    if (iStack_2b8 == 1000) {
      pcStack_2c8 = (code *)0x13be66;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_2c8 = test_int64;
  test_timestamp_cold_3();
  pcStack_2c8 = (code *)0x13e3df;
  pcStack_2e0 = (code *)0x13be88;
  lStack_2d8 = extraout_RAX_01;
  uStack_2d0 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_2e0 = (code *)0x13beac;
  uVar6 = bcon_new(0,"foo",uVar6,0x11,10,0);
  pcStack_2e0 = (code *)0x13beb4;
  uVar7 = bson_bcone_magic();
  pcStack_2e0 = (code *)0x13becf;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x11,&lStack_2d8,0);
  if (cVar1 == '\0') {
    pcStack_2e0 = (code *)0x13beef;
    test_int64_cold_1();
  }
  else if (lStack_2d8 == 10) {
    pcStack_2e0 = (code *)0x13bee2;
    bson_destroy(uVar6);
    return;
  }
  pcStack_2e0 = test_maxkey;
  test_int64_cold_2();
  pcStack_2e0 = (code *)0x13e3df;
  pcStack_2f8 = (code *)0x13befd;
  uStack_2e8 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_2f8 = (code *)0x13bf1b;
  uVar6 = bcon_new(0,"foo",uVar6,0x13,0);
  pcStack_2f8 = (code *)0x13bf23;
  uVar7 = bson_bcone_magic();
  pcStack_2f8 = (code *)0x13bf3b;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x13,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  pcStack_2f8 = test_minkey;
  test_maxkey_cold_1();
  pcStack_2f8 = (code *)0x13e3df;
  apcStack_310[0] = (code *)0x13bf5c;
  uStack_300 = uVar6;
  uVar6 = bson_bcon_magic();
  apcStack_310[0] = (code *)0x13bf7a;
  uVar6 = bcon_new(0,"foo",uVar6,0x14,0);
  apcStack_310[0] = (code *)0x13bf82;
  uVar7 = bson_bcone_magic();
  apcStack_310[0] = (code *)0x13bf9a;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x14,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  apcStack_310[0] = test_bson_document;
  test_minkey_cold_1();
  uStack_318 = 0;
  pcStack_320 = "foo";
  apcStack_508[0] = (code *)0x13bfe3;
  uStack_338 = uVar6;
  uStack_330 = uVar10;
  puStack_328 = puVar25;
  apcStack_310[0] = (code *)&stack0xffffffffffffff30;
  uVar9 = bcon_new(0,"bar","baz",0);
  apcStack_508[0] = (code *)0x13bfeb;
  uVar6 = bson_bcon_magic();
  pcVar27 = "foo";
  apcStack_508[0] = (code *)0x13c00c;
  uVar10 = bcon_new(0,"foo",uVar6,2,uVar9,0);
  apcStack_508[0] = (code *)0x13c014;
  uVar6 = bson_bcone_magic();
  apcStack_508[0] = (code *)0x13c034;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,2,auStack_480,0);
  if (cVar1 == '\0') {
LAB_0013c1b7:
    apcStack_508[0] = (code *)0x13c1bc;
    test_bson_document_cold_1();
LAB_0013c1bc:
    apcStack_508[0] = (code *)0x13c1c1;
    test_bson_document_cold_6();
LAB_0013c1c1:
    apcStack_508[0] = (code *)0x13c1c6;
    test_bson_document_cold_5();
LAB_0013c1c6:
    apcStack_508[0] = (code *)0x13c1cb;
    test_bson_document_cold_2();
  }
  else {
    apcStack_508[0] = (code *)0x13c04c;
    pvVar8 = (void *)bson_get_data(auStack_480);
    apcStack_508[0] = (code *)0x13c057;
    pcVar27 = (char *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_47c) {
      apcStack_508[0] = (code *)0x13c06b;
      pvVar11 = (void *)bson_get_data(uVar9);
      apcStack_508[0] = (code *)0x13c07b;
      pvVar12 = (void *)bson_get_data(auStack_480);
      apcStack_508[0] = (code *)0x13c089;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        apcStack_508[0] = (code *)0x13c09a;
        bson_destroy(auStack_480);
        apcStack_508[0] = (code *)0x13c0a2;
        bson_destroy(uVar9);
        apcStack_508[0] = (code *)0x13c0aa;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar25 = auStack_480;
    apcStack_508[0] = (code *)0x13c0cb;
    uVar6 = bson_as_canonical_extended_json(puVar25);
    apcStack_508[0] = (code *)0x13c0d8;
    uVar7 = bson_as_canonical_extended_json(uVar9);
    uVar10 = 0xffffffff;
    if (uStack_47c != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar9 + 4) == (int)uVar19) break;
        if (*(char *)((long)pvVar8 + uVar19) != pcVar27[uVar19]) {
          uVar10 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (uStack_47c != (uint)uVar19);
    }
    if ((int)uVar10 == -1) {
      uVar3 = uStack_47c;
      if (uStack_47c < *(uint *)(uVar9 + 4)) {
        uVar3 = *(uint *)(uVar9 + 4);
      }
      uVar10 = (ulong)(uVar3 - 1);
    }
    apcStack_508[0] = (code *)0x13c133;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar10,uVar6,uVar7);
    apcStack_508[0] = (code *)0x13c14b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar10 = (ulong)uVar3;
    apcStack_508[0] = (code *)0x13c166;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_484 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c1bc;
    puVar25 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013c1c1;
    uVar10 = (ulong)uStack_47c;
    apcStack_508[0] = (code *)0x13c190;
    uVar19 = write(uVar3,pvVar8,uVar10);
    if (uVar19 != uVar10) goto LAB_0013c1c6;
    uVar9 = (ulong)*(uint *)(uVar9 + 4);
    apcStack_508[0] = (code *)0x13c1a6;
    uVar19 = write(uVar4,pcVar27,uVar9);
    if (uVar19 == uVar9) {
      apcStack_508[0] = (code *)0x13c1b7;
      test_bson_document_cold_4();
      goto LAB_0013c1b7;
    }
  }
  apcStack_508[0] = test_bson_array;
  test_bson_document_cold_3();
  pcStack_708 = (code *)0x13c201;
  uStack_530 = uVar9;
  uStack_528 = uVar10;
  puStack_520 = puVar25;
  pcStack_518 = pcVar27;
  pvStack_510 = pvVar8;
  apcStack_508[0] = (code *)apcStack_310;
  uVar9 = bcon_new(0,"0","baz",0);
  pcStack_708 = (code *)0x13c209;
  uVar6 = bson_bcon_magic();
  pcVar27 = "foo";
  pcStack_708 = (code *)0x13c22a;
  uVar10 = bcon_new(0,"foo",uVar6,3,uVar9,0);
  pcStack_708 = (code *)0x13c232;
  uVar6 = bson_bcone_magic();
  pcStack_708 = (code *)0x13c252;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,3,auStack_680,0);
  if (cVar1 == '\0') {
LAB_0013c3d5:
    pcStack_708 = (code *)0x13c3da;
    test_bson_array_cold_1();
LAB_0013c3da:
    pcStack_708 = (code *)0x13c3df;
    test_bson_array_cold_6();
LAB_0013c3df:
    pcStack_708 = (code *)0x13c3e4;
    test_bson_array_cold_5();
LAB_0013c3e4:
    pcStack_708 = (code *)0x13c3e9;
    test_bson_array_cold_2();
  }
  else {
    pcStack_708 = (code *)0x13c26a;
    pvVar8 = (void *)bson_get_data(auStack_680);
    pcStack_708 = (code *)0x13c275;
    pcVar27 = (char *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_67c) {
      pcStack_708 = (code *)0x13c289;
      pvVar11 = (void *)bson_get_data(uVar9);
      pcStack_708 = (code *)0x13c299;
      pvVar12 = (void *)bson_get_data(auStack_680);
      pcStack_708 = (code *)0x13c2a7;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        pcStack_708 = (code *)0x13c2b8;
        bson_destroy(auStack_680);
        pcStack_708 = (code *)0x13c2c0;
        bson_destroy(uVar9);
        pcStack_708 = (code *)0x13c2c8;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar25 = auStack_680;
    pcStack_708 = (code *)0x13c2e9;
    uVar6 = bson_as_canonical_extended_json(puVar25);
    pcStack_708 = (code *)0x13c2f6;
    uVar7 = bson_as_canonical_extended_json(uVar9);
    uVar10 = 0xffffffff;
    if (uStack_67c != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar9 + 4) == (int)uVar19) break;
        if (*(char *)((long)pvVar8 + uVar19) != pcVar27[uVar19]) {
          uVar10 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (uStack_67c != (uint)uVar19);
    }
    if ((int)uVar10 == -1) {
      uVar3 = uStack_67c;
      if (uStack_67c < *(uint *)(uVar9 + 4)) {
        uVar3 = *(uint *)(uVar9 + 4);
      }
      uVar10 = (ulong)(uVar3 - 1);
    }
    pcStack_708 = (code *)0x13c351;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar10,uVar6,uVar7);
    pcStack_708 = (code *)0x13c369;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar10 = (ulong)uVar3;
    pcStack_708 = (code *)0x13c384;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_684 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c3da;
    puVar25 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013c3df;
    uVar10 = (ulong)uStack_67c;
    pcStack_708 = (code *)0x13c3ae;
    uVar19 = write(uVar3,pvVar8,uVar10);
    if (uVar19 != uVar10) goto LAB_0013c3e4;
    uVar9 = (ulong)*(uint *)(uVar9 + 4);
    pcStack_708 = (code *)0x13c3c4;
    uVar19 = write(uVar4,pcVar27,uVar9);
    if (uVar19 == uVar9) {
      pcStack_708 = (code *)0x13c3d5;
      test_bson_array_cold_4();
      goto LAB_0013c3d5;
    }
  }
  pcStack_708 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_740 = (code *)0x13c3fe;
  uStack_738 = extraout_RAX_02;
  uStack_730 = uVar9;
  uStack_728 = uVar10;
  puStack_720 = puVar25;
  pcStack_718 = pcVar27;
  pvStack_710 = pvVar8;
  pcStack_708 = (code *)apcStack_508;
  uStack_768 = bson_bcon_magic();
  pcStack_748 = (char *)0x0;
  pcStack_750 = "]";
  puStack_758 = (undefined1 *)0x2;
  uStack_760 = 0xf;
  uStack_770 = 0x13c446;
  uVar6 = bcon_new(0,"foo","[",uStack_768,0xf,1);
  pcStack_740 = (code *)0x13c452;
  uStack_768 = bson_bcone_magic();
  pcStack_748 = (char *)0x0;
  pcStack_750 = "]";
  uStack_760 = 0xf;
  uStack_770 = 0x13c481;
  puStack_758 = (undefined1 *)&uStack_738;
  cVar1 = bcon_extract(uVar6,"foo","[",uStack_768,0xf,(long)&uStack_738 + 4);
  if (cVar1 == '\0') {
    pcStack_740 = (code *)0x13c4b2;
    test_inline_array_cold_1();
LAB_0013c4b2:
    pcStack_740 = (code *)0x13c4b7;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_738._4_4_ != 1) goto LAB_0013c4b2;
    if ((int)uStack_738 == 2) {
      pcStack_740 = (code *)0x13c49e;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_740 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_740 = (code *)0x147feb;
  pcStack_748 = "[";
  pcStack_750 = "foo";
  puStack_758 = (undefined1 *)0x0;
  uStack_760 = 0xf;
  pcStack_778 = (code *)0x13c4cc;
  uStack_770 = extraout_RAX_03;
  uStack_768 = uVar6;
  pcStack_7a0 = (char *)bson_bcon_magic();
  pcStack_780 = (char *)0x0;
  pcStack_788 = "}";
  pcStack_790 = (char *)0x1;
  pcStack_798 = (char *)0xf;
  uStack_7a8 = "a";
  uStack_7b0 = 2;
  uStack_7b8 = 0x13c51f;
  uVar6 = bcon_new(0,"foo","{","b",pcStack_7a0,0xf);
  pcStack_778 = (code *)0x13c52b;
  pcStack_7a0 = (char *)bson_bcone_magic();
  uStack_7b0 = (long)&uStack_770 + 4;
  pcStack_780 = (char *)0x0;
  pcStack_788 = "}";
  pcStack_798 = (char *)0xf;
  uStack_7a8 = "b";
  uStack_7b8 = 0x13c56e;
  pcStack_790 = (char *)&uStack_770;
  cVar1 = bcon_extract(uVar6,"foo","{","a",pcStack_7a0,0xf);
  if (cVar1 == '\0') {
    pcStack_778 = (code *)0x13c59f;
    test_inline_doc_cold_1();
LAB_0013c59f:
    pcStack_778 = (code *)0x13c5a4;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_770._4_4_ != 1) goto LAB_0013c59f;
    if ((int)uStack_770 == 2) {
      pcStack_778 = (code *)0x13c58b;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_778 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_778 = (code *)0x0;
  pcStack_780 = "a";
  pcStack_790 = "{";
  pcStack_798 = "foo";
  pcStack_7a0 = "}";
  pcStack_7c0 = (code *)0x13c5bc;
  pcStack_788 = (char *)uVar6;
  uStack_7f8 = (undefined8 *)bson_bcon_magic();
  pcStack_7c0 = (code *)0x0;
  pcStack_7c8 = (char *)0x3;
  pbStack_7d0 = (bson_t *)0xf;
  pcStack_7e0 = "c";
  pcStack_7e8 = (char *)0x2;
  pcStack_7f0 = (char *)0xf;
  uStack_800 = 0x13c5fe;
  uStack_7d8 = uStack_7f8;
  bson = (bson_t *)bcon_new(0,"a",uStack_7f8,0xf,1,"b");
  pcStack_7c0 = (code *)0x13c60a;
  pcStack_808 = (code *)bson_bcone_magic();
  pbStack_7d0 = (bson_t *)((long)&uStack_7b0 + 4);
  uStack_7f8 = &uStack_7a8;
  pcStack_7c8 = (char *)0x0;
  uStack_7d8 = 0xf;
  pcStack_7e8 = "c";
  pcStack_7f0 = (char *)0x0;
  uStack_800 = 0xf;
  pcStack_810 = "b";
  pcStack_818 = (char *)0x0;
  pcStack_820 = (char *)0x13c656;
  pcStack_7e0 = (char *)pcStack_808;
  test_extract_ctx_helper(bson,3,"a",pcStack_808,0xf,(long)&uStack_7a8 + 4);
  if (uStack_7a8._4_4_ == 1) {
    if ((int)uStack_7a8 != 2) goto LAB_0013c68b;
    if (uStack_7b0._4_4_ == 3) {
      pcStack_7c0 = (code *)0x13c677;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_7c0 = (code *)0x13c68b;
    test_extract_ctx_cold_1();
LAB_0013c68b:
    pcStack_7c0 = (code *)0x13c690;
    test_extract_ctx_cold_2();
  }
  pcStack_7c0 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_7c0 = (code *)0xf;
  pcStack_7c8 = "a";
  uStack_7d8 = 0;
  pcStack_7e8 = "c";
  pcStack_808 = (code *)0x13c6a8;
  pcStack_7e0 = (char *)((long)&uStack_7a8 + 4);
  pbStack_7d0 = bson;
  uStack_830 = bson_bcon_magic();
  pcStack_810 = (char *)0x0;
  pcStack_818 = "}";
  pcStack_820 = (char *)0xa;
  pcStack_828 = (char *)0xf;
  pcStack_838 = (char *)0x13c6fd;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_808 = (code *)0x13c709;
  uStack_830 = bson_bcone_magic();
  pcStack_820 = (char *)((long)&uStack_7f8 + 4);
  pcStack_810 = (char *)0x0;
  pcStack_818 = "}";
  pcStack_828 = (char *)0xf;
  pcStack_838 = "bar";
  pcStack_840 = (code *)0x13f9a8;
  uStack_848 = 0x13c745;
  cVar1 = bcon_extract(uVar6,"hello",uStack_830,0,&pcStack_7f0,"foo");
  if (cVar1 == '\0') {
    pcStack_808 = (code *)0x13c785;
    test_nested_cold_1();
LAB_0013c785:
    pcStack_808 = (code *)0x13c78a;
    test_nested_cold_2();
  }
  else {
    pcStack_808 = (code *)0x13c75e;
    iVar2 = strcmp("world",pcStack_7f0);
    if (iVar2 != 0) goto LAB_0013c785;
    if (uStack_7f8._4_4_ == 10) {
      pcStack_808 = (code *)0x13c771;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_808 = test_skip;
  test_nested_cold_3();
  pcStack_808 = (code *)0x148ce7;
  pcStack_810 = "bar";
  pcStack_818 = (char *)0x0;
  pcStack_820 = "hello";
  pcStack_828 = "foo";
  pcStack_840 = (code *)0x13c79f;
  uStack_830 = uVar6;
  pcStack_868 = (char *)bson_bcon_magic();
  uStack_848 = 0;
  pcStack_850 = "}";
  pcStack_858 = (char *)0xa;
  pcStack_860 = (char *)0xf;
  pcStack_870 = (char *)0x13c7f2;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_840 = (code *)0x13c7fe;
  pcVar27 = (char *)bson_bcone_magic();
  pcVar26 = "}";
  uStack_848 = 0;
  pcStack_850 = "}";
  pcStack_858 = (char *)0x10;
  pcStack_860 = (char *)0x1c;
  pcStack_870 = "bar";
  pcStack_878 = "{";
  uStack_880 = 0x13c83a;
  pcStack_868 = pcVar27;
  cVar1 = bcon_extract(uVar6,"hello",pcVar27,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_840 = (code *)0x13c89c;
    test_skip_cold_1();
  }
  else {
    uStack_848 = 0;
    pcStack_850 = "}";
    pcStack_858 = (char *)0x12;
    pcStack_860 = (char *)0x1c;
    pcStack_870 = "bar";
    pcStack_878 = "{";
    uStack_880 = 0x13c879;
    pcStack_868 = pcVar27;
    cVar1 = bcon_extract(uVar6,"hello",pcVar27,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_840 = test_iter;
  test_skip_cold_2();
  pcStack_840 = (code *)0x14c89e;
  pcStack_850 = "bar";
  pcStack_858 = "}";
  pcStack_868 = "{";
  apcStack_a08[0] = (code *)0x13c8be;
  pcStack_860 = pcVar27;
  uStack_848 = uVar6;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_a08[0] = (code *)0x13c8e5;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_a08[0] = (code *)0x13c8ed;
  uVar6 = bson_bcone_magic();
  pcVar13 = acStack_980;
  pcVar20 = "foo";
  uVar7 = 0x1d;
  uVar23 = 0;
  apcStack_a08[0] = (code *)0x13c90d;
  pcVar21 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar6);
  uVar6 = extraout_XMM1_Qa;
  if (cVar1 == '\0') {
LAB_0013cabc:
    apcStack_a08[0] = (code *)0x13cac1;
    test_iter_cold_1();
LAB_0013cac1:
    apcStack_a08[0] = (code *)0x13cac6;
    test_iter_cold_2();
LAB_0013cac6:
    apcStack_a08[0] = (code *)0x13cacb;
    test_iter_cold_3();
LAB_0013cacb:
    apcStack_a08[0] = (code *)0x13cad0;
    test_iter_cold_8();
LAB_0013cad0:
    apcStack_a08[0] = (code *)0x13cad5;
    test_iter_cold_7();
  }
  else {
    pcVar21 = acStack_980;
    apcStack_a08[0] = (code *)0x13c922;
    iVar2 = bson_iter_type();
    uVar6 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013cac1;
    pcVar21 = acStack_980;
    apcStack_a08[0] = (code *)0x13c938;
    iVar2 = bson_iter_int32();
    uVar6 = extraout_XMM1_Qa_01;
    if (iVar2 != 10) goto LAB_0013cac6;
    uVar23 = 0;
    apcStack_a08[0] = (code *)0x13c964;
    __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_980);
    apcStack_a08[0] = (code *)0x13c96f;
    pcVar27 = (char *)bson_get_data(__n_00);
    apcStack_a08[0] = (code *)0x13c97a;
    __buf = (char *)bson_get_data(__n);
    if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
      apcStack_a08[0] = (code *)0x13c98e;
      pvVar8 = (void *)bson_get_data(__n);
      apcStack_a08[0] = (code *)0x13c999;
      pvVar11 = (void *)bson_get_data(__n_00);
      apcStack_a08[0] = (code *)0x13c9a7;
      iVar2 = bcmp(pvVar8,pvVar11,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        apcStack_a08[0] = (code *)0x13c9b3;
        bson_destroy(__n);
        apcStack_a08[0] = (code *)0x13c9bb;
        bson_destroy(__n_00);
        return;
      }
    }
    apcStack_a08[0] = (code *)0x13c9d4;
    uVar7 = bson_as_canonical_extended_json(__n_00);
    apcStack_a08[0] = (code *)0x13c9e1;
    pcVar13 = (char *)bson_as_canonical_extended_json(__n);
    uVar3 = *(uint *)(__n_00 + 4);
    uVar9 = 0xffffffff;
    if (uVar3 != 0) {
      uVar10 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar10) break;
        if (pcVar27[uVar10] != __buf[uVar10]) {
          uVar9 = uVar10 & 0xffffffff;
          break;
        }
        uVar10 = uVar10 + 1;
      } while (uVar3 != (uint)uVar10);
    }
    if ((int)uVar9 == -1) {
      if (uVar3 < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar9 = (ulong)(uVar3 - 1);
    }
    apcStack_a08[0] = (code *)0x13ca3c;
    uVar6 = extraout_XMM1_Qa_02;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9);
    apcStack_a08[0] = (code *)0x13ca54;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar26 = (char *)(ulong)uVar3;
    pcVar21 = "failure.expected.bson";
    pcVar20 = (char *)0x42;
    apcStack_a08[0] = (code *)0x13ca6f;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_984 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013cacb;
    if (uVar4 == 0xffffffff) goto LAB_0013cad0;
    pcVar26 = (char *)(ulong)uVar4;
    __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
    pcVar21 = (char *)(ulong)uVar3;
    apcStack_a08[0] = (code *)0x13ca95;
    pcVar20 = pcVar27;
    pcVar14 = (char *)write(uVar3,pcVar27,(size_t)__n_00);
    if (pcVar14 == __n_00) {
      __n = (char *)(ulong)*(uint *)(__n + 4);
      apcStack_a08[0] = (code *)0x13caab;
      pcVar20 = __buf;
      pcVar21 = pcVar26;
      pcVar14 = (char *)write(uVar4,__buf,(size_t)__n);
      if (pcVar14 != __n) goto LAB_0013cada;
      pcVar21 = (char *)(ulong)uStack_984;
      pcVar20 = (char *)(ulong)uVar4;
      apcStack_a08[0] = (code *)0x13cabc;
      test_iter_cold_6();
      goto LAB_0013cabc;
    }
  }
  apcStack_a08[0] = (code *)0x13cada;
  test_iter_cold_4();
LAB_0013cada:
  apcStack_a08[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_7040 = auStack_7030;
  if (extraout_AL != '\0') {
    uStack_6ff0 = uVar6;
  }
  puStack_7088 = (undefined8 *)0x13cb62;
  pcStack_7028 = pcVar20;
  uStack_7018 = uVar7;
  pcStack_7010 = pcVar13;
  uStack_7008 = uVar23;
  pcStack_a28 = __n;
  pcStack_a20 = pcVar27;
  pcStack_a18 = __buf;
  pcStack_a10 = __n_00;
  apcStack_a08[0] = (code *)&pcStack_840;
  bcon_extract_ctx_init(aDStack_6f80);
  puStack_7048 = auStack_9f8;
  uStack_7050 = 0x3000000010;
  uVar6 = 0x10;
  if (0 < (int)(uint)pcStack_7028) {
    uVar3 = (uint)pcStack_7028;
    do {
      puStack_7088 = (undefined8 *)0x13cbce;
      __s = aDStack_6f80;
      pcVar27 = pcVar21;
      cVar1 = bcon_extract_ctx_va(pcVar21,aDStack_6f80,&uStack_7050);
      iVar2 = (int)uVar6;
      if (cVar1 == '\0') {
        puStack_7088 = (undefined8 *)0x13cbe9;
        test_extract_ctx_helper_cold_1();
        pcStack_70b0 = (code *)0x13cc03;
        __name = __s;
        pcStack_70a8 = pcVar21;
        uStack_70a0 = (ulong)uVar3;
        pcStack_7098 = pcVar26;
        pDStack_7090 = aDStack_6f80;
        puStack_7088 = &uStack_7050;
        pcVar26 = (char *)strlen(pcVar27);
        pcStack_70b0 = (code *)0x13cc0e;
        pDVar22 = __s;
        sVar15 = strlen((char *)__s);
        if ((int)sVar15 + (int)pcVar26 < 499) {
          pcStack_70b0 = (code *)0x13cc2a;
          memset(__dest,0,500);
          pcStack_70b0 = (code *)0x13cc38;
          strncat(__dest,pcVar27,(long)(int)pcVar26);
          pcStack_70b0 = (code *)0x13cc40;
          sVar16 = strlen(__dest);
          (__dest + sVar16)[0] = '/';
          (__dest + sVar16)[1] = '\0';
          pcStack_70b0 = (code *)0x13cc54;
          strncat(__dest,(char *)__s,(long)(int)sVar15);
          pcVar27 = __dest;
          do {
            if (*pcVar27 == '\\') {
              *pcVar27 = '/';
            }
            else if (*pcVar27 == '\0') {
              return;
            }
            pcVar27 = pcVar27 + 1;
          } while( true );
        }
        pcStack_70b0 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar9 = (ulong)extraout_EDX;
        pDStack_7378 = (DIR *)0x13cc9e;
        __filename = __name;
        iStack_736c = iVar2;
        sStack_70d0 = sVar15;
        pcStack_70c8 = pcVar26;
        pDStack_70c0 = __s;
        pcStack_70b8 = pcVar27;
        pcStack_70b0 = (code *)apcStack_a08;
        __dirp = opendir((char *)__name);
        pDVar24 = pDVar22;
        pDStack_7380 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013cdc9;
        pDStack_7378 = (DIR *)0x13ccb2;
        __filename = __dirp;
        pdVar17 = readdir(__dirp);
        if (pdVar17 == (dirent *)0x0) goto LAB_0013cda8;
        pcVar26 = "..";
        pDVar24 = (DIR *)0x147699;
        pDStack_7368 = pDVar22;
        goto LAB_0013ccd1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
LAB_0013cd12:
  pDStack_7378 = (DIR *)0x13cd25;
  assemble_path((char *)__name,pcVar27,acStack_72d0);
  pDStack_7378 = (DIR *)0x13cd32;
  iVar5 = stat(pcVar27,&sStack_7360);
  if ((iVar5 == 0) && ((sStack_7360.st_mode & 0xf000) == 0x4000)) {
    pDStack_7378 = (DIR *)0x13cd60;
    uVar3 = collect_tests_from_dir((char (*) [500])pDStack_7368,acStack_72d0,iVar2,iStack_736c);
    uVar9 = (ulong)uVar3;
  }
  else {
    pDStack_7378 = (DIR *)0x13cd73;
    pcVar13 = strstr(pcVar27,".json");
    if (pcVar13 != (char *)0x0) {
      uVar9 = (ulong)(iVar2 + 1);
      pDStack_7378 = (DIR *)0x13cd94;
      assemble_path((char *)__name,pcVar27,(char *)(pDStack_7368 + (long)iVar2 * 500));
    }
  }
  pDStack_7378 = (DIR *)0x13cd9c;
  __filename = __dirp;
  pdVar17 = readdir(__dirp);
  if (pdVar17 == (dirent *)0x0) {
LAB_0013cda8:
    pDStack_7378 = (DIR *)0x13cdb0;
    closedir(__dirp);
    return;
  }
LAB_0013ccd1:
  iVar2 = (int)uVar9;
  if (iVar2 < iStack_736c) {
    do {
      pcVar27 = pdVar17->d_name;
      pDStack_7378 = (DIR *)0x13ccea;
      iVar5 = strcmp(pcVar27,"..");
      if (iVar5 != 0) {
        pDStack_7378 = (DIR *)0x13ccf9;
        iVar5 = strcmp(pcVar27,".");
        if (iVar5 != 0) goto LAB_0013cd12;
      }
      pDStack_7378 = (DIR *)0x13cd05;
      pdVar17 = readdir(__dirp);
      if (pdVar17 == (dirent *)0x0) goto LAB_0013cda8;
    } while( true );
  }
  pDStack_7378 = (DIR *)0x13cdc9;
  collect_tests_from_dir_cold_1();
  pDStack_7380 = __dirp;
LAB_0013cdc9:
  pDStack_7378 = (DIR *)get_bson_from_json_file;
  collect_tests_from_dir_cold_2();
  uStack_7398 = uVar9;
  pDStack_7390 = pDVar24;
  pcStack_7388 = pcVar26;
  pDStack_7378 = __name;
  __stream = fopen((char *)__filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar15 = ftell(__stream);
    fseek(__stream,0,0);
    if (0 < (long)sVar15) {
      pvVar8 = (void *)bson_malloc0(sVar15);
      sVar16 = fread(pvVar8,1,sVar15,__stream);
      if (sVar16 != sVar15) {
        abort();
      }
      fclose(__stream);
      if (pvVar8 != (void *)0x0) {
        lVar18 = bson_new_from_json(pvVar8,sVar15,auStack_7598);
        if (lVar18 == 0) {
          fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7590);
          abort();
        }
        bson_free(pvVar8);
      }
    }
  }
  return;
}

Assistant:

static void
test_null (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_null (&expected, "foo", -1);

   BCON_APPEND (&bcon, "foo", BCON_NULL);

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}